

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O3

void __thiscall
CTxMemPoolEntry::CTxMemPoolEntry
          (CTxMemPoolEntry *this,CTransactionRef *tx,CAmount fee,int64_t time,uint entry_height,
          uint64_t entry_sequence,bool spends_coinbase,int64_t sigops_cost,LockPoints lp)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer puVar7;
  SizeComputer SVar8;
  int iVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pvVar14;
  pointer pCVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  const_iterator it;
  pointer pCVar20;
  element_type *peVar21;
  long in_FS_OFFSET;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  ulong uVar19;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar21 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar21;
  p_Var2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      peVar21 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  p_Var1 = &(this->m_parents)._M_t._M_impl.super__Rb_tree_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nFee = fee;
  local_50.nSize = 0;
  local_48.m_params = &::TX_NO_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (peVar21,&local_48,&::TX_NO_WITNESS);
  SVar8.nSize = local_50.nSize;
  local_50.nSize = 0;
  local_48.m_params = &::TX_WITH_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (peVar21,&local_48,&::TX_WITH_WITNESS);
  iVar9 = (int)SVar8.nSize * 3 + (int)local_50.nSize;
  this->nTxWeight = iVar9;
  peVar21 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar21 == (element_type *)0x0) {
    sVar17 = 0;
  }
  else {
    pCVar15 = (peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar3 = (peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar13 = 0;
    pCVar4 = (peVar21->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar12 = (long)pCVar3 + (0x1f - (long)pCVar15) & 0xfffffffffffffff0;
    if (pCVar3 == pCVar15) {
      uVar12 = uVar13;
    }
    pCVar20 = (peVar21->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = (long)pCVar4 + (0x1f - (long)pCVar20) & 0xfffffffffffffff0;
    if (pCVar4 == pCVar20) {
      uVar11 = uVar13;
    }
    lVar16 = uVar11 + uVar12;
    for (; pCVar20 !=
           (peVar21->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish; pCVar20 = pCVar20 + 1) {
      pvVar14 = (pCVar20->scriptWitness).stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = *(pointer *)
                ((long)&(pCVar20->scriptWitness).stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
      uVar12 = (long)pvVar5 + (0x1f - (long)pvVar14) & 0xfffffffffffffff0;
      if (pvVar5 == pvVar14) {
        uVar12 = uVar13;
      }
      uVar11 = (ulong)(pCVar20->scriptSig).super_CScriptBase._union.indirect_contents.capacity;
      if ((pCVar20->scriptSig).super_CScriptBase._size < 0x1d) {
        uVar11 = uVar13;
      }
      uVar19 = uVar11 + 0x1f & 0x1fffffff0;
      if ((int)uVar11 == 0) {
        uVar19 = uVar13;
      }
      lVar18 = uVar19 + uVar12;
      for (; pvVar14 !=
             *(pointer *)
              ((long)&(pCVar20->scriptWitness).stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8); pvVar14 = pvVar14 + 1) {
        puVar6 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar7 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        if (puVar6 != puVar7) {
          uVar12 = (ulong)(puVar6 + (0x1f - (long)puVar7)) & 0xfffffffffffffff0;
        }
        lVar18 = lVar18 + uVar12;
      }
      lVar16 = lVar16 + lVar18;
    }
    pCVar3 = (peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar15 != pCVar3) {
      do {
        uVar12 = (ulong)(pCVar15->scriptPubKey).super_CScriptBase._union.indirect_contents.capacity;
        if ((pCVar15->scriptPubKey).super_CScriptBase._size < 0x1d) {
          uVar12 = 0;
        }
        uVar13 = 0;
        if ((int)uVar12 != 0) {
          uVar13 = uVar12 + 0x1f & 0x1fffffff0;
        }
        lVar16 = lVar16 + uVar13;
        pCVar15 = pCVar15 + 1;
      } while (pCVar15 != pCVar3);
    }
    sVar17 = lVar16 + 0xc0;
  }
  this->nUsageSize = sVar17;
  this->nTime = time;
  this->entry_sequence = entry_sequence;
  this->entryHeight = entry_height;
  this->spendsCoinbase = spends_coinbase;
  this->sigOpCost = sigops_cost;
  this->m_modified_fee = this->nFee;
  (this->lockPoints).height = lp.height;
  *(undefined4 *)&(this->lockPoints).field_0x4 = lp._4_4_;
  (this->lockPoints).time = lp.time;
  (this->lockPoints).maxInputBlock = lp.maxInputBlock;
  this->m_count_with_descendants = 1;
  iVar10 = GetVirtualTransactionSize((long)iVar9,sigops_cost,nBytesPerSigOp);
  this->nSizeWithDescendants = (long)(int)iVar10;
  this->nModFeesWithDescendants = this->nFee;
  this->m_count_with_ancestors = 1;
  iVar10 = GetVirtualTransactionSize((long)this->nTxWeight,this->sigOpCost,nBytesPerSigOp);
  this->nSizeWithAncestors = (long)(int)iVar10;
  this->nModFeesWithAncestors = this->nFee;
  this->nSigOpCostWithAncestors = this->sigOpCost;
  (this->m_epoch_marker).m_marker = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CTxMemPoolEntry(const CTransactionRef& tx, CAmount fee,
                    int64_t time, unsigned int entry_height, uint64_t entry_sequence,
                    bool spends_coinbase,
                    int64_t sigops_cost, LockPoints lp)
        : tx{tx},
          nFee{fee},
          nTxWeight{GetTransactionWeight(*tx)},
          nUsageSize{RecursiveDynamicUsage(tx)},
          nTime{time},
          entry_sequence{entry_sequence},
          entryHeight{entry_height},
          spendsCoinbase{spends_coinbase},
          sigOpCost{sigops_cost},
          m_modified_fee{nFee},
          lockPoints{lp},
          nSizeWithDescendants{GetTxSize()},
          nModFeesWithDescendants{nFee},
          nSizeWithAncestors{GetTxSize()},
          nModFeesWithAncestors{nFee},
          nSigOpCostWithAncestors{sigOpCost} {}